

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

void __thiscall
TPZFrontSym<std::complex<double>_>::Compress(TPZFrontSym<std::complex<double>_> *this)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  complex<double> *pcVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  complex<double> *pcVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int64_t iVar20;
  TPZStack<long,_10> from;
  
  TPZStack<long,_10>::TPZStack(&from);
  for (lVar19 = 0; lVar19 < (this->super_TPZFront<std::complex<double>_>).fFront;
      lVar19 = lVar19 + 1) {
    if ((this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fStore[lVar19] !=
        -1) {
      TPZStack<long,_10>::Push(&from,lVar19);
    }
  }
  plVar4 = (this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fStore;
  plVar5 = (this->super_TPZFront<std::complex<double>_>).fLocal.fStore;
  lVar12 = 0;
  lVar19 = 0;
  if (0 < from.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements) {
    lVar19 = from.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  }
  for (; lVar19 != lVar12; lVar12 = lVar12 + 1) {
    lVar14 = plVar4[from.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar12]];
    plVar4[lVar12] = lVar14;
    plVar5[lVar14] = lVar12;
  }
  plVar4 = (this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fStore;
  for (lVar12 = lVar19;
      lVar12 < (this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fNElements;
      lVar12 = lVar12 + 1) {
    plVar4[lVar12] = -1;
  }
  iVar20 = (this->super_TPZFront<std::complex<double>_>).fFree.super_TPZManVector<int,_10>.
           super_TPZVec<int>.fNElements +
           from.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  if (iVar20 != (this->super_TPZFront<std::complex<double>_>).fFront) {
    std::operator<<((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n");
    iVar20 = (this->super_TPZFront<std::complex<double>_>).fFront;
  }
  (this->super_TPZFront<std::complex<double>_>).fFront =
       from.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  TPZManVector<int,_10>::Resize
            (&(this->super_TPZFront<std::complex<double>_>).fFree.super_TPZManVector<int,_10>,0);
  TPZManVector<long,_10>::Resize
            (&(this->super_TPZFront<std::complex<double>_>).fGlobal,
             (this->super_TPZFront<std::complex<double>_>).fFront);
  if ((this->super_TPZFront<std::complex<double>_>).fData.fNElements != 0) {
    lVar12 = 1;
    lVar14 = 2;
    lVar13 = 0;
    lVar15 = 0;
    while (lVar15 != lVar19) {
      lVar16 = lVar13 * 8;
      for (lVar17 = 0; lVar12 != lVar17; lVar17 = lVar17 + 1) {
        lVar6 = from.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar17];
        lVar18 = from.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar15];
        lVar11 = lVar18;
        if (lVar18 < lVar6) {
          lVar11 = lVar6;
        }
        if (lVar6 < lVar18) {
          lVar18 = lVar6;
        }
        pcVar7 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
        pcVar3 = pcVar7 + ((lVar11 + 1) * lVar11) / 2 + lVar18;
        uVar8 = *(undefined4 *)(pcVar3->_M_value + 4);
        uVar9 = *(undefined4 *)(pcVar3->_M_value + 8);
        uVar10 = *(undefined4 *)(pcVar3->_M_value + 0xc);
        puVar1 = (undefined4 *)(pcVar7->_M_value + lVar16);
        *puVar1 = *(undefined4 *)pcVar3->_M_value;
        puVar1[1] = uVar8;
        puVar1[2] = uVar9;
        puVar1[3] = uVar10;
        lVar16 = lVar16 + 0x10;
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + lVar14;
      lVar14 = lVar14 + 2;
      lVar15 = lVar15 + 1;
    }
    while (lVar12 = lVar19, lVar12 < (int)iVar20) {
      for (lVar14 = 0; lVar19 = lVar12 + 1, lVar12 + 1 != lVar14; lVar14 = lVar14 + 1) {
        lVar19 = lVar12;
        if (lVar12 < lVar14) {
          lVar19 = lVar14;
        }
        lVar15 = lVar12;
        if (lVar14 < lVar12) {
          lVar15 = lVar14;
        }
        puVar2 = (undefined8 *)
                 ((this->super_TPZFront<std::complex<double>_>).fData.fStore[lVar15]._M_value +
                 ((lVar19 + 1) * lVar19 & 0xfffffffffffffffeU) * 8);
        *puVar2 = 0;
        puVar2[1] = 0;
      }
    }
  }
  TPZManVector<long,_10>::~TPZManVector(&from.super_TPZManVector<long,_10>);
  return;
}

Assistant:

void TPZFrontSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress",output);
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	int frontold = this->fFront;
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i <= j; i++){
			Element(i,j) = Element(from[i], from[j]);
		}
		//		fGlobal[i] = fGlobal[from[i]];
		//		this->fLocal[fGlobal[i]] = i;
	}
	for(;j<frontold;j++) {
		for(i=0;i<= j; i++) Element(i,j) = 0.;
	}
	
	//	Print("After Compress", cout);
	//	PrintGlobal("After Compress",output);
}